

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isGatherOffsetsResultValid
               (Texture2DArrayView *texture,Sampler *sampler,IntLookupPrecision *prec,Vec3 *coord,
               int componentNdx,IVec2 (*offsets) [4],IVec4 *result)

{
  bool bVar1;
  int iVar2;
  Vec2 local_40;
  IVec2 layerRange;
  
  if (texture->m_numLevels < 1) {
    iVar2 = 0;
  }
  else {
    iVar2 = (texture->m_levels->m_size).m_data[2];
  }
  computeLayerRange((tcu *)&layerRange,iVar2,(prec->coordBits).m_data[2],coord->m_data[2]);
  do {
    iVar2 = layerRange.m_data[0];
    if (layerRange.m_data[1] < iVar2) break;
    local_40.m_data = *(float (*) [2])coord->m_data;
    bVar1 = isGatherOffsetsResultValid<tcu::IntLookupPrecision,int>
                      (texture->m_levels,sampler,prec,&local_40,iVar2,componentNdx,offsets,result);
    layerRange.m_data[0] = iVar2 + 1;
  } while (!bVar1);
  return iVar2 <= layerRange.m_data[1];
}

Assistant:

bool isGatherOffsetsResultValid (const Texture2DArrayView&		texture,
								 const Sampler&					sampler,
								 const IntLookupPrecision&		prec,
								 const Vec3&					coord,
								 int							componentNdx,
								 const IVec2					(&offsets)[4],
								 const IVec4&					result)
{
	return is2DArrayGatherOffsetsResultValid(texture, sampler, prec, coord, componentNdx, offsets, result);
}